

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i alVar1;
  __m256i alVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  __m256i alVar10;
  __m256i alVar11;
  __m256i c;
  __m256i c_00;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  int iVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m256i *ptr;
  __m256i *palVar19;
  __m256i *b;
  __m256i *ptr_00;
  __m256i *b_00;
  __m256i *ptr_01;
  __m256i *b_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_04;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  longlong lVar23;
  undefined8 uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  __m256i *palVar28;
  int iVar29;
  int iVar30;
  __m256i *palVar31;
  ulong uVar32;
  longlong lVar33;
  int iVar34;
  long lVar35;
  longlong lVar36;
  int iVar37;
  uint uVar38;
  __m256i *ptr_05;
  long lVar39;
  long lVar40;
  uint uVar41;
  ulong size;
  bool bVar42;
  undefined1 auVar44 [16];
  undefined1 auVar43 [16];
  undefined1 auVar49 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar72 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined8 in_stack_fffffffffffffcd8;
  int iVar82;
  undefined4 in_stack_fffffffffffffce8;
  int iVar83;
  __m256i *local_2e8;
  undefined1 local_2b8 [32];
  
  auVar59 = in_ZMM7._0_16_;
  auVar71 = in_ZMM6._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar15 = uVar3 - 1;
          size = (ulong)uVar3 + 3 >> 2;
          uVar8 = (ulong)uVar15 % size;
          iVar16 = (int)(uVar15 / size);
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          uVar26 = CONCAT44(0,open);
          iVar37 = -open;
          iVar17 = ppVar5->min;
          uVar20 = 0x8000000000000000 - (long)iVar17;
          if (iVar17 != iVar37 && SBORROW4(iVar17,iVar37) == iVar17 + open < 0) {
            uVar20 = uVar26 | 0x8000000000000000;
          }
          iVar17 = ppVar5->max;
          ppVar18 = parasail_result_new_stats();
          if (ppVar18 != (parasail_result_t *)0x0) {
            ppVar18->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x4810802;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar19 = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            auVar51._8_8_ = 0;
            auVar51._0_8_ = ptr;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = palVar19;
            auVar51 = vpunpcklqdq_avx(auVar51,auVar56);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = b;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = ptr_00;
            auVar56 = vpunpcklqdq_avx(auVar43,auVar49);
            auVar43 = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar51;
            auVar49 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = b_00;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = ptr_01;
            auVar51 = vpunpcklqdq_avx(auVar50,auVar57);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = b_01;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = ptr_02;
            auVar56 = vpunpcklqdq_avx(auVar58,auVar60);
            auVar51 = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar51;
            auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
            auVar45._0_8_ = -(ulong)(auVar43._0_8_ == 0);
            auVar45._8_8_ = -(ulong)(auVar43._8_8_ == 0);
            auVar45._16_8_ = -(ulong)(auVar49._0_8_ == 0);
            auVar45._24_8_ = -(ulong)(auVar49._8_8_ == 0);
            auVar53._0_8_ = -(ulong)(auVar51._0_8_ == 0);
            auVar53._8_8_ = -(ulong)(auVar51._8_8_ == 0);
            auVar53._16_8_ = -(ulong)(auVar56._0_8_ == 0);
            auVar53._24_8_ = -(ulong)(auVar56._8_8_ == 0);
            auVar45 = vpackssdw_avx2(auVar45,auVar53);
            if (((((b_02 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) && b_03 != (__m256i *)0x0)
                 && b_04 != (__m256i *)0x0) && ptr_04 != (int64_t *)0x0) &&
                ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar45 >> 0x7f,0) == '\0') &&
                   (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar45 >> 0xbf,0) == '\0') &&
                 (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar45[0x1f])) {
              iVar83 = s2Len + -1;
              iVar30 = -iVar16;
              iVar29 = iVar30 + 3;
              auVar46._8_4_ = gap;
              auVar46._0_8_ = CONCAT44(0,gap);
              auVar46._12_4_ = 0;
              auVar46._16_4_ = gap;
              auVar46._20_4_ = 0;
              auVar46._24_4_ = gap;
              auVar46._28_4_ = 0;
              lVar27 = uVar20 + 1;
              lVar35 = 0x7ffffffffffffffe - (long)iVar17;
              bVar42 = s1_beg != 0;
              alVar10[1] = lVar27;
              alVar10[0] = in_stack_fffffffffffffcd8;
              alVar10[2]._0_4_ = in_stack_fffffffffffffce8;
              alVar10[2]._4_4_ = uVar15;
              alVar10[3]._0_4_ = iVar83;
              alVar10[3]._4_4_ = iVar16;
              lVar40 = lVar27;
              parasail_memset___m256i(b,alVar10,size);
              alVar11[1] = lVar40;
              alVar11[0] = in_stack_fffffffffffffcd8;
              alVar11[2]._0_4_ = in_stack_fffffffffffffce8;
              alVar11[2]._4_4_ = uVar15;
              alVar11[3]._0_4_ = iVar83;
              alVar11[3]._4_4_ = iVar16;
              parasail_memset___m256i(b_00,alVar11,size);
              alVar1[1] = lVar40;
              alVar1[0] = in_stack_fffffffffffffcd8;
              alVar1[2]._0_4_ = in_stack_fffffffffffffce8;
              alVar1[2]._4_4_ = uVar15;
              alVar1[3]._0_4_ = iVar83;
              alVar1[3]._4_4_ = iVar16;
              parasail_memset___m256i(b_01,alVar1,size);
              alVar2[1] = lVar40;
              alVar2[0] = in_stack_fffffffffffffcd8;
              alVar2[2]._0_4_ = in_stack_fffffffffffffce8;
              alVar2[2]._4_4_ = uVar15;
              alVar2[3]._0_4_ = iVar83;
              alVar2[3]._4_4_ = iVar16;
              parasail_memset___m256i(b_02,alVar2,size);
              c[1] = lVar40;
              c[0] = in_stack_fffffffffffffcd8;
              c[2]._0_4_ = in_stack_fffffffffffffce8;
              c[2]._4_4_ = uVar15;
              c[3]._0_4_ = iVar83;
              c[3]._4_4_ = iVar16;
              parasail_memset___m256i(b_03,c,size);
              c_00[1] = lVar40;
              c_00[0] = in_stack_fffffffffffffcd8;
              c_00[2]._0_4_ = in_stack_fffffffffffffce8;
              c_00[2]._4_4_ = uVar15;
              c_00[3]._0_4_ = iVar83;
              c_00[3]._4_4_ = iVar16;
              parasail_memset___m256i(b_04,c_00,size);
              auVar74._8_4_ = open;
              auVar74._0_8_ = uVar26;
              auVar74._12_4_ = 0;
              auVar74._16_4_ = open;
              auVar74._20_4_ = 0;
              auVar74._24_4_ = open;
              auVar74._28_4_ = 0;
              uVar20 = (ulong)iVar37;
              uVar41 = (uint)size;
              auVar65._4_4_ = uVar41;
              auVar65._0_4_ = uVar41;
              auVar65._8_4_ = uVar41;
              auVar65._12_4_ = uVar41;
              auVar65._16_4_ = uVar41;
              auVar65._20_4_ = uVar41;
              auVar65._24_4_ = uVar41;
              auVar65._28_4_ = uVar41;
              auVar47._8_4_ = gap;
              auVar47._0_8_ = CONCAT44(0,gap);
              auVar47._12_4_ = 0;
              auVar47._16_4_ = gap;
              auVar47._20_4_ = 0;
              auVar47._24_4_ = gap;
              auVar47._28_4_ = 0;
              auVar54._8_8_ = uVar20;
              auVar54._0_8_ = uVar20;
              auVar54._16_8_ = uVar20;
              auVar54._24_8_ = uVar20;
              auVar53 = vpmuldq_avx2(auVar65,_DAT_00908b60);
              auVar61[1] = bVar42;
              auVar61[0] = bVar42;
              auVar61[2] = bVar42;
              auVar61[3] = bVar42;
              auVar61[4] = bVar42;
              auVar61[5] = bVar42;
              auVar61[6] = bVar42;
              auVar61[7] = bVar42;
              auVar61[8] = bVar42;
              auVar61[9] = bVar42;
              auVar61[10] = bVar42;
              auVar61[0xb] = bVar42;
              auVar61[0xc] = bVar42;
              auVar61[0xd] = bVar42;
              auVar61[0xe] = bVar42;
              auVar61[0xf] = bVar42;
              uVar21 = 0;
              auVar51 = vpslld_avx(auVar61,0x1f);
              auVar51 = vpsrad_avx(auVar51,0x1f);
              auVar45 = vpmovsxdq_avx2(auVar51);
              palVar28 = ptr;
              palVar31 = ptr_03;
              do {
                auVar64._8_8_ = uVar21;
                auVar64._0_8_ = uVar21;
                auVar64._16_8_ = uVar21;
                auVar64._24_8_ = uVar21;
                auVar65 = vpaddq_avx2(auVar53,auVar64);
                auVar64 = vpmuludq_avx2(auVar65,auVar47);
                auVar65 = vpsrlq_avx2(auVar65,0x20);
                auVar65 = vpmuludq_avx2(auVar65,auVar47);
                auVar65 = vpsllq_avx2(auVar65,0x20);
                auVar65 = vpaddq_avx2(auVar64,auVar65);
                auVar65 = vpsubq_avx2(auVar54,auVar65);
                alVar10 = (__m256i)vpandn_avx2(auVar45,auVar65);
                alVar11 = (__m256i)vpsubq_avx2((undefined1  [32])alVar10,auVar74);
                *palVar28 = alVar10;
                *palVar31 = alVar11;
                uVar21 = uVar21 + 1;
                palVar31 = palVar31 + 1;
                palVar28 = palVar28 + 1;
              } while (size != uVar21);
              *ptr_04 = 0;
              lVar22 = (ulong)(uint)s2Len - 1;
              auVar68._8_8_ = lVar22;
              auVar68._0_8_ = lVar22;
              auVar68._16_8_ = lVar22;
              auVar68._24_8_ = lVar22;
              auVar44._4_4_ = gap;
              auVar44._0_4_ = gap;
              auVar44._8_4_ = gap;
              auVar44._12_4_ = gap;
              auVar52._4_4_ = iVar37;
              auVar52._0_4_ = iVar37;
              auVar52._8_4_ = iVar37;
              auVar52._12_4_ = iVar37;
              auVar51 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar21 = 0;
              auVar45 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar66._8_8_ = 0x8000000000000000;
              auVar66._0_8_ = 0x8000000000000000;
              auVar66._16_8_ = 0x8000000000000000;
              auVar66._24_8_ = 0x8000000000000000;
              auVar71 = vpcmpeqd_avx2(auVar71,auVar71);
              auVar59 = vpcmpeqd_avx(auVar59,auVar59);
              auVar78._8_4_ = 4;
              auVar78._0_8_ = 0x400000004;
              auVar78._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar56 = vpaddd_avx(auVar51,auVar59);
                  auVar56 = vpmulld_avx(auVar56,auVar44);
                  auVar56 = vpsubd_avx(auVar52,auVar56);
                  auVar53 = vpmovsxdq_avx2(auVar56);
                }
                else {
                  auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar76._8_8_ = uVar21;
                auVar76._0_8_ = uVar21;
                auVar76._16_8_ = uVar21;
                auVar76._24_8_ = uVar21;
                auVar74 = vpor_avx2(auVar76,auVar45);
                auVar74 = vpcmpgtq_avx2(auVar74 ^ auVar66,auVar68 ^ auVar66);
                auVar53 = vpmaskmovq_avx2(auVar74 ^ auVar71,auVar53);
                *(undefined1 (*) [32])(ptr_04 + uVar21 + 1) = auVar53;
                uVar21 = uVar21 + 4;
                auVar51 = vpaddd_avx(auVar78,auVar51);
              } while ((s2Len + 3U & 0xfffffffc) != uVar21);
              uVar25 = uVar41 - 1;
              uVar21 = 0;
              auVar71._8_8_ = lVar27;
              auVar71._0_8_ = lVar27;
              auVar71._16_8_ = lVar27;
              auVar71._24_8_ = lVar27;
              auVar72 = ZEXT3264(auVar71);
              auVar63 = ZEXT3264(auVar71);
              auVar67 = ZEXT3264(auVar71);
              auVar69 = ZEXT3264(auVar71);
              auVar73 = ZEXT3264(auVar71);
              auVar48 = ZEXT3264(CONCAT824(lVar35,CONCAT816(lVar35,CONCAT88(lVar35,lVar35))));
              iVar17 = iVar83;
              do {
                palVar31 = ptr_01;
                palVar28 = ptr_00;
                local_2e8 = ptr_02;
                ptr_05 = ptr;
                ptr = palVar19;
                ptr_02 = b_01;
                ptr_01 = b_00;
                ptr_00 = b;
                alVar10 = ptr_00[uVar25];
                alVar11 = ptr_01[uVar25];
                alVar1 = ptr_02[uVar25];
                auVar59 = SUB3216(ptr_05[uVar25],0);
                auVar77._0_16_ = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar48._0_16_;
                auVar77._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar59;
                auVar71 = vpalignr_avx2((undefined1  [32])ptr_05[uVar25],auVar77,8);
                auVar45 = vperm2i128_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar10,8);
                auVar45 = vpalignr_avx2((undefined1  [32])alVar10,auVar45,8);
                auVar53 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,8);
                auVar53 = vpalignr_avx2((undefined1  [32])alVar11,auVar53,8);
                auVar74 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar74 = vpalignr_avx2((undefined1  [32])alVar1,auVar74,8);
                auVar71 = vpblendd_avx2(auVar71,ZEXT832((ulong)ptr_04[uVar21]),3);
                lVar39 = (long)ppVar5->mapper[(byte)s2[uVar21]] * size * 0x20;
                auVar81 = ZEXT864(0) << 0x40;
                lVar22 = 0;
                local_2b8._8_8_ = 1;
                local_2b8._0_8_ = 1;
                local_2b8._16_8_ = 1;
                local_2b8._24_8_ = 1;
                auVar75 = ZEXT1664((undefined1  [16])0x0);
                auVar80 = ZEXT3264(CONCAT824(lVar27,CONCAT816(lVar27,CONCAT88(lVar27,lVar27))));
                do {
                  auVar47 = *(undefined1 (*) [32])((long)*ptr_03 + lVar22);
                  auVar66 = vpaddq_avx2(auVar71,*(undefined1 (*) [32])
                                                 ((long)pvVar4 + lVar22 + lVar39));
                  auVar71 = *(undefined1 (*) [32])((long)*b_02 + lVar22);
                  auVar54 = vpcmpgtq_avx2(auVar66,auVar47);
                  auVar65 = vblendvpd_avx(auVar47,auVar66,auVar54);
                  auVar54 = *(undefined1 (*) [32])((long)*b_03 + lVar22);
                  auVar79 = auVar80._0_32_;
                  auVar68 = vpcmpgtq_avx2(auVar65,auVar79);
                  auVar64 = vblendvpd_avx(auVar79,auVar65,auVar68);
                  auVar65 = *(undefined1 (*) [32])((long)*b_04 + lVar22);
                  *(undefined1 (*) [32])((long)*ptr + lVar22) = auVar64;
                  auVar62._0_8_ = -(ulong)(auVar64._0_8_ == auVar66._0_8_);
                  auVar62._8_8_ = -(ulong)(auVar64._8_8_ == auVar66._8_8_);
                  auVar62._16_8_ = -(ulong)(auVar64._16_8_ == auVar66._16_8_);
                  auVar62._24_8_ = -(ulong)(auVar64._24_8_ == auVar66._24_8_);
                  auVar66 = vblendvpd_avx(auVar75._0_32_,auVar71,auVar68);
                  auVar45 = vpaddq_avx2(auVar45,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar22 + lVar39));
                  auVar45 = vblendvpd_avx(auVar66,auVar45,auVar62);
                  *(undefined1 (*) [32])((long)*palVar28 + lVar22) = auVar45;
                  auVar66 = vblendvpd_avx(auVar81._0_32_,auVar54,auVar68);
                  auVar53 = vpaddq_avx2(auVar53,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar22 + lVar39));
                  auVar53 = vblendvpd_avx(auVar66,auVar53,auVar62);
                  auVar66 = vblendvpd_avx(local_2b8,auVar65,auVar68);
                  auVar68 = vpcmpeqd_avx2(auVar68,auVar68);
                  auVar74 = vpsubq_avx2(auVar74,auVar68);
                  auVar74 = vblendvpd_avx(auVar66,auVar74,auVar62);
                  *(undefined1 (*) [32])((long)*palVar31 + lVar22) = auVar53;
                  *(undefined1 (*) [32])((long)*local_2e8 + lVar22) = auVar74;
                  auVar66 = vpcmpgtq_avx2(auVar64,auVar48._0_32_);
                  auVar66 = vblendvpd_avx(auVar64,auVar48._0_32_,auVar66);
                  auVar48 = ZEXT3264(auVar66);
                  auVar66 = vpcmpgtq_avx2(auVar72._0_32_,auVar64);
                  auVar66 = vblendvpd_avx(auVar64,auVar72._0_32_,auVar66);
                  auVar68 = vpcmpgtq_avx2(auVar66,auVar45);
                  auVar66 = vblendvpd_avx(auVar45,auVar66,auVar68);
                  auVar68 = vpcmpgtq_avx2(auVar66,auVar53);
                  auVar66 = vblendvpd_avx(auVar53,auVar66,auVar68);
                  auVar68 = vpcmpgtq_avx2(auVar66,auVar74);
                  auVar66 = vblendvpd_avx(auVar74,auVar66,auVar68);
                  auVar13._8_4_ = open;
                  auVar13._0_8_ = uVar26;
                  auVar13._12_4_ = 0;
                  auVar13._16_4_ = open;
                  auVar13._20_4_ = 0;
                  auVar13._24_4_ = open;
                  auVar13._28_4_ = 0;
                  auVar76 = vpsubq_avx2(auVar64,auVar13);
                  auVar47 = vpsubq_avx2(auVar47,auVar46);
                  auVar68 = vpcmpgtq_avx2(auVar76,auVar47);
                  auVar47 = vblendvpd_avx(auVar47,auVar76,auVar68);
                  auVar71 = vblendvpd_avx(auVar71,auVar45,auVar68);
                  auVar54 = vblendvpd_avx(auVar54,auVar53,auVar68);
                  auVar64 = vpcmpeqd_avx2(auVar65,auVar65);
                  auVar65 = vpsubq_avx2(auVar65,auVar64);
                  auVar77 = vpsubq_avx2(auVar74,auVar64);
                  auVar74 = vblendvpd_avx(auVar65,auVar77,auVar68);
                  auVar70 = ZEXT3264(auVar74);
                  *(undefined1 (*) [32])((long)*ptr_03 + lVar22) = auVar47;
                  *(undefined1 (*) [32])((long)*b_02 + lVar22) = auVar71;
                  *(undefined1 (*) [32])((long)*b_03 + lVar22) = auVar54;
                  *(undefined1 (*) [32])((long)*b_04 + lVar22) = auVar74;
                  auVar71 = vpsubq_avx2(auVar79,auVar46);
                  auVar74 = vpcmpgtq_avx2(auVar76,auVar71);
                  auVar71 = vblendvpd_avx(auVar71,auVar76,auVar74);
                  auVar80 = ZEXT3264(auVar71);
                  auVar71 = vblendvpd_avx(auVar75._0_32_,auVar45,auVar74);
                  auVar75 = ZEXT3264(auVar71);
                  auVar71 = vblendvpd_avx(auVar81._0_32_,auVar53,auVar74);
                  auVar81 = ZEXT3264(auVar71);
                  auVar71 = vpsubq_avx2(local_2b8,auVar64);
                  auVar72 = ZEXT3264(auVar66);
                  local_2b8 = vblendvpd_avx(auVar71,auVar77,auVar74);
                  auVar71 = *(undefined1 (*) [32])((long)*ptr_05 + lVar22);
                  auVar45 = *(undefined1 (*) [32])((long)*ptr_00 + lVar22);
                  auVar53 = *(undefined1 (*) [32])((long)*ptr_01 + lVar22);
                  auVar74 = *(undefined1 (*) [32])((long)*ptr_02 + lVar22);
                  lVar22 = lVar22 + 0x20;
                } while (size << 5 != lVar22);
                iVar37 = 0;
                auVar79._8_4_ = open;
                auVar79._0_8_ = uVar26;
                auVar79._12_4_ = 0;
                auVar79._16_4_ = open;
                auVar79._20_4_ = 0;
                auVar79._24_4_ = open;
                auVar79._28_4_ = 0;
                do {
                  uVar32 = uVar20;
                  if (s2_beg == 0) {
                    uVar32 = ptr_04[uVar21 + 1] - uVar26;
                  }
                  auVar53 = vpermq_avx2((undefined1  [32])ptr_05[uVar25],0x90);
                  auVar45 = vpermpd_avx2(auVar80._0_32_,0x90);
                  auVar74 = auVar75._0_32_;
                  auVar71 = vperm2f128_avx(auVar74,auVar74,8);
                  auVar71 = vpalignr_avx2(auVar74,auVar71,8);
                  auVar75 = ZEXT3264(auVar71);
                  auVar74 = auVar81._0_32_;
                  auVar71 = vperm2f128_avx(auVar74,auVar74,8);
                  auVar71 = vpalignr_avx2(auVar74,auVar71,8);
                  auVar81 = ZEXT3264(auVar71);
                  auVar74 = vpermq_avx2(local_2b8,0x90);
                  auVar71 = vpblendd_avx2(auVar53,ZEXT832((ulong)ptr_04[uVar21]),3);
                  auVar45 = vblendpd_avx(auVar45,ZEXT832(uVar32),1);
                  auVar80 = ZEXT3264(auVar45);
                  local_2b8 = vpblendd_avx2(auVar74,SUB6432(ZEXT864(1),0),3);
                  lVar22 = 0;
                  auVar45 = vpcmpeqd_avx2(auVar70._0_32_,auVar70._0_32_);
                  auVar70 = ZEXT3264(auVar45);
                  do {
                    auVar45 = vpaddq_avx2(auVar71,*(undefined1 (*) [32])
                                                   ((long)pvVar4 + lVar22 + lVar39));
                    auVar71 = *(undefined1 (*) [32])((long)*ptr + lVar22);
                    auVar64 = auVar80._0_32_;
                    auVar53 = vpcmpgtq_avx2(auVar71,auVar64);
                    auVar71 = vblendvpd_avx(auVar64,auVar71,auVar53);
                    *(undefined1 (*) [32])((long)*ptr + lVar22) = auVar71;
                    auVar55._0_8_ = -(ulong)(auVar71._0_8_ == auVar45._0_8_);
                    auVar55._8_8_ = -(ulong)(auVar71._8_8_ == auVar45._8_8_);
                    auVar55._16_8_ = -(ulong)(auVar71._16_8_ == auVar45._16_8_);
                    auVar55._24_8_ = -(ulong)(auVar71._24_8_ == auVar45._24_8_);
                    auVar74 = vpor_avx2(auVar55,auVar53);
                    auVar45 = vblendvpd_avx(auVar75._0_32_,
                                            *(undefined1 (*) [32])((long)*palVar28 + lVar22),auVar74
                                           );
                    *(undefined1 (*) [32])((long)*palVar28 + lVar22) = auVar45;
                    auVar53 = vblendvpd_avx(auVar81._0_32_,
                                            *(undefined1 (*) [32])((long)*palVar31 + lVar22),auVar74
                                           );
                    *(undefined1 (*) [32])((long)*palVar31 + lVar22) = auVar53;
                    auVar74 = vblendvpd_avx(local_2b8,
                                            *(undefined1 (*) [32])((long)*local_2e8 + lVar22),
                                            auVar74);
                    *(undefined1 (*) [32])((long)*local_2e8 + lVar22) = auVar74;
                    auVar47 = vpcmpgtq_avx2(auVar71,auVar48._0_32_);
                    auVar47 = vblendvpd_avx(auVar71,auVar48._0_32_,auVar47);
                    auVar48 = ZEXT3264(auVar47);
                    auVar54 = vpcmpgtq_avx2(auVar72._0_32_,auVar71);
                    auVar54 = vblendvpd_avx(auVar71,auVar72._0_32_,auVar54);
                    auVar65 = vpcmpgtq_avx2(auVar54,auVar45);
                    auVar54 = vblendvpd_avx(auVar45,auVar54,auVar65);
                    auVar65 = vpcmpgtq_avx2(auVar54,auVar53);
                    auVar54 = vblendvpd_avx(auVar53,auVar54,auVar65);
                    auVar65 = vpcmpgtq_avx2(auVar54,auVar74);
                    auVar54 = vblendvpd_avx(auVar74,auVar54,auVar65);
                    auVar72 = ZEXT3264(auVar54);
                    auVar71 = vpsubq_avx2(auVar71,auVar79);
                    auVar64 = vpsubq_avx2(auVar64,auVar46);
                    auVar80 = ZEXT3264(auVar64);
                    auVar64 = vpcmpgtq_avx2(auVar71,auVar64);
                    auVar66 = auVar70._0_32_;
                    auVar71 = auVar66 & ~auVar64;
                    auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                    if ((((auVar71 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar71 >> 0x7f,0) == '\0') && SUB321(auVar71 >> 0xbf,0) == '\0') &&
                        -1 < auVar71[0x1f]) goto LAB_007998ed;
                    auVar71 = vblendvpd_avx(auVar75._0_32_,auVar45,auVar64);
                    auVar75 = ZEXT3264(auVar71);
                    auVar71 = vblendvpd_avx(auVar81._0_32_,auVar53,auVar64);
                    auVar81 = ZEXT3264(auVar71);
                    auVar71 = vblendvpd_avx(local_2b8,auVar74,auVar64);
                    local_2b8 = vpsubq_avx2(auVar71,auVar65);
                    auVar71 = *(undefined1 (*) [32])((long)*ptr_05 + lVar22);
                    lVar22 = lVar22 + 0x20;
                    auVar45 = vpcmpeqd_avx2(auVar66,auVar66);
                    auVar70 = ZEXT3264(auVar45);
                  } while (size << 5 != lVar22);
                  iVar37 = iVar37 + 1;
                } while (iVar37 != 4);
LAB_007998ed:
                auVar45 = vpcmpgtq_avx2((undefined1  [32])ptr[uVar8],auVar73._0_32_);
                auVar71 = vblendvpd_avx(auVar73._0_32_,(undefined1  [32])ptr[uVar8],auVar45);
                auVar59 = auVar71._16_16_;
                auVar73 = ZEXT3264(auVar71);
                auVar71 = vblendvpd_avx(auVar69._0_32_,(undefined1  [32])palVar28[uVar8],auVar45);
                auVar51 = auVar71._16_16_;
                auVar69 = ZEXT3264(auVar71);
                auVar71 = vblendvpd_avx(auVar67._0_32_,(undefined1  [32])palVar31[uVar8],auVar45);
                auVar56 = auVar71._16_16_;
                auVar67 = ZEXT3264(auVar71);
                auVar71 = vblendvpd_avx(auVar63._0_32_,(undefined1  [32])local_2e8[uVar8],auVar45);
                auVar43 = auVar71._16_16_;
                auVar63 = ZEXT3264(auVar71);
                auVar9._8_8_ = -(ulong)(iVar29 == 2);
                auVar9._0_8_ = -(ulong)(iVar29 == 3);
                auVar9._16_8_ = -(ulong)(iVar29 == 1);
                auVar9._24_8_ = -(ulong)(iVar30 == -3);
                auVar9 = auVar9 & auVar45;
                if ((((auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') || SUB321(auVar9 >> 0xbf,0) != '\0') ||
                    auVar9[0x1f] < '\0') {
                  iVar17 = (int)uVar21;
                }
                uVar21 = uVar21 + 1;
                b = palVar28;
                b_00 = palVar31;
                b_01 = local_2e8;
                palVar19 = ptr_05;
                if (uVar21 == (uint)s2Len) {
                  if (s2_end == 0) {
                    lVar23 = 0;
                    lVar33 = 0;
                    lVar36 = 0;
                  }
                  else {
                    if (iVar16 < 3) {
                      iVar37 = 0;
                      do {
                        auVar45 = auVar73._0_32_;
                        auVar71 = vperm2i128_avx2(auVar45,auVar45,8);
                        auVar71 = vpalignr_avx2(auVar45,auVar71,8);
                        auVar59 = auVar71._16_16_;
                        auVar73 = ZEXT3264(auVar71);
                        auVar45 = auVar69._0_32_;
                        auVar71 = vperm2i128_avx2(auVar45,auVar45,8);
                        auVar71 = vpalignr_avx2(auVar45,auVar71,8);
                        auVar51 = auVar71._16_16_;
                        auVar69 = ZEXT3264(auVar71);
                        auVar45 = auVar67._0_32_;
                        auVar71 = vperm2i128_avx2(auVar45,auVar45,8);
                        auVar71 = vpalignr_avx2(auVar45,auVar71,8);
                        auVar56 = auVar71._16_16_;
                        auVar67 = ZEXT3264(auVar71);
                        auVar45 = auVar63._0_32_;
                        auVar71 = vperm2i128_avx2(auVar45,auVar45,8);
                        auVar71 = vpalignr_avx2(auVar45,auVar71,8);
                        auVar43 = auVar71._16_16_;
                        auVar63 = ZEXT3264(auVar71);
                        iVar37 = iVar37 + 1;
                      } while (iVar37 < iVar29);
                    }
                    lVar40 = vpextrq_avx(auVar59,1);
                    lVar23 = vpextrq_avx(auVar51,1);
                    lVar33 = vpextrq_avx(auVar56,1);
                    lVar36 = vpextrq_avx(auVar43,1);
                  }
                  iVar34 = (int)lVar36;
                  iVar30 = (int)lVar33;
                  iVar37 = (int)lVar23;
                  uVar25 = uVar15;
                  if ((s1_end != 0) && (((ulong)uVar3 + 3 & 0x7ffffffc) != 0)) {
                    uVar20 = 0;
                    lVar22 = lVar40;
                    do {
                      uVar38 = ((uint)uVar20 & 3) * uVar41 + ((uint)(uVar20 >> 2) & 0x3fffffff);
                      lVar40 = lVar22;
                      if ((int)uVar38 < (int)uVar3) {
                        lVar39 = (*ptr)[uVar20];
                        lVar40 = lVar39;
                        if ((lVar22 < lVar39) ||
                           (((lVar40 = lVar22, lVar39 == lVar22 && (iVar17 == iVar83)) &&
                            ((int)uVar38 < (int)uVar25)))) {
                          lVar23 = (*palVar28)[uVar20];
                          lVar33 = (*palVar31)[uVar20];
                          lVar36 = (*local_2e8)[uVar20];
                          iVar17 = iVar83;
                          uVar25 = uVar38;
                        }
                      }
                      iVar34 = (int)lVar36;
                      iVar30 = (int)lVar33;
                      iVar37 = (int)lVar23;
                      uVar20 = uVar20 + 1;
                      lVar22 = lVar40;
                    } while ((uVar41 & 0x1fffffff) << 2 != (int)uVar20);
                  }
                  iVar82 = (int)lVar40;
                  if (s2_end == 0 && s1_end == 0) {
                    alVar10 = ptr[uVar8];
                    auVar59 = alVar10._16_16_;
                    alVar11 = palVar28[uVar8];
                    auVar51 = alVar11._16_16_;
                    alVar1 = palVar31[uVar8];
                    auVar56 = alVar1._16_16_;
                    alVar2 = local_2e8[uVar8];
                    auVar43 = alVar2._16_16_;
                    if (iVar16 < 3) {
                      iVar17 = 0;
                      do {
                        auVar71 = vperm2i128_avx2((undefined1  [32])alVar10,
                                                  (undefined1  [32])alVar10,8);
                        alVar10 = (__m256i)vpalignr_avx2((undefined1  [32])alVar10,auVar71,8);
                        auVar59 = alVar10._16_16_;
                        auVar71 = vperm2i128_avx2((undefined1  [32])alVar11,
                                                  (undefined1  [32])alVar11,8);
                        alVar11 = (__m256i)vpalignr_avx2((undefined1  [32])alVar11,auVar71,8);
                        auVar51 = alVar11._16_16_;
                        auVar71 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                  8);
                        alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar71,8);
                        auVar56 = alVar1._16_16_;
                        auVar71 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                  8);
                        alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar71,8);
                        auVar43 = alVar2._16_16_;
                        iVar17 = iVar17 + 1;
                      } while (iVar17 < iVar29);
                    }
                    uVar24 = vpextrq_avx(auVar59,1);
                    iVar82 = (int)uVar24;
                    uVar24 = vpextrq_avx(auVar51,1);
                    iVar37 = (int)uVar24;
                    uVar24 = vpextrq_avx(auVar56,1);
                    iVar30 = (int)uVar24;
                    uVar24 = vpextrq_avx(auVar43,1);
                    iVar34 = (int)uVar24;
                    iVar17 = iVar83;
                    uVar25 = uVar15;
                  }
                  auVar12._8_8_ = lVar27;
                  auVar12._0_8_ = lVar27;
                  auVar12._16_8_ = lVar27;
                  auVar12._24_8_ = lVar27;
                  auVar71 = vpcmpgtq_avx2(auVar12,auVar47);
                  auVar14._8_8_ = lVar35;
                  auVar14._0_8_ = lVar35;
                  auVar14._16_8_ = lVar35;
                  auVar14._24_8_ = lVar35;
                  auVar45 = vpcmpgtq_avx2(auVar54,auVar14);
                  auVar71 = vpor_avx2(auVar45,auVar71);
                  if ((((auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar71 >> 0x7f,0) != '\0') || SUB321(auVar71 >> 0xbf,0) != '\0') ||
                      auVar71[0x1f] < '\0') {
                    *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                    iVar82 = 0;
                    iVar37 = 0;
                    iVar30 = 0;
                    iVar34 = 0;
                    iVar17 = 0;
                    uVar25 = 0;
                  }
                  ppVar18->score = iVar82;
                  ppVar18->end_query = uVar25;
                  ppVar18->end_ref = iVar17;
                  ((ppVar18->field_4).stats)->matches = iVar37;
                  ((ppVar18->field_4).stats)->similar = iVar30;
                  ((ppVar18->field_4).stats)->length = iVar34;
                  parasail_free(ptr_04);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_2e8);
                  parasail_free(ptr_01);
                  parasail_free(palVar31);
                  parasail_free(ptr_00);
                  parasail_free(palVar28);
                  parasail_free(ptr_05);
                  parasail_free(ptr);
                  return ppVar18;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}